

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void __thiscall
slang::SourceManager::addDiagnosticDirective
          (SourceManager *this,SourceLocation location,string_view name,DiagnosticSeverity severity)

{
  const_iterator cVar1;
  DiagnosticDirectiveInfo *pDVar2;
  SourceLocation SVar3;
  vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
  *this_00;
  ulong uVar4;
  const_iterator __position;
  ulong uVar5;
  ulong uVar6;
  size_t offset;
  unique_lock<std::shared_mutex> lock;
  DiagnosticSeverity local_4c;
  ulong local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  BufferID local_2c;
  unique_lock<std::shared_mutex> local_28;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  local_4c = severity;
  SVar3 = getFullyExpandedLoc(this,location);
  std::unique_lock<std::shared_mutex>::unique_lock(&local_28,&this->mut);
  uVar6 = (ulong)SVar3 >> 0x1c;
  local_2c.id = SVar3._0_4_ & 0xfffffff;
  local_48 = uVar6;
  this_00 = (vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
             *)ska::
               flat_hash_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
               ::operator[](&this->diagDirectives,&local_2c);
  cVar1._M_current = *(DiagnosticDirectiveInfo **)this_00;
  pDVar2 = *(DiagnosticDirectiveInfo **)(this_00 + 8);
  if ((cVar1._M_current == pDVar2) || (pDVar2[-1].offset <= uVar6)) {
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              (this_00,&local_40,&local_48,&local_4c);
  }
  else {
    uVar5 = (long)pDVar2 - (long)cVar1._M_current >> 5;
    while (__position._M_current = cVar1._M_current, 0 < (long)uVar5) {
      uVar4 = uVar5 >> 1;
      uVar5 = ~uVar4 + uVar5;
      cVar1._M_current = __position._M_current + uVar4 + 1;
      if (uVar6 < __position._M_current[uVar4].offset) {
        uVar5 = uVar4;
        cVar1._M_current = __position._M_current;
      }
    }
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    _M_emplace_aux<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              (this_00,__position,&local_40,&local_48,&local_4c);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void SourceManager::addDiagnosticDirective(SourceLocation location, string_view name,
                                           DiagnosticSeverity severity) {
    SourceLocation fileLocation = getFullyExpandedLoc(location);

    std::unique_lock lock(mut);

    size_t offset = fileLocation.offset();
    auto& vec = diagDirectives[fileLocation.buffer()];
    if (vec.empty() || offset >= vec.back().offset)
        vec.emplace_back(name, offset, severity);
    else {
        // Keep the list in sorted order. Typically new additions should be at the end,
        // in which case we'll hit the condition above, but just in case we will do the
        // full search and insert here.
        vec.emplace(std::upper_bound(vec.begin(), vec.end(), offset,
                                     [](size_t offset, auto& diag) {
                                         return offset < diag.offset;
                                     }),
                    name, offset, severity);
    }
}